

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat4x2.c
# Opt level: O0

void glmc_mat4x2_copy(vec2 *src,vec2 *dest)

{
  vec2 *dest_local;
  vec2 *src_local;
  
  (*dest)[0] = (*src)[0];
  (*dest)[1] = (*src)[1];
  dest[1][0] = src[1][0];
  dest[1][1] = src[1][1];
  dest[2][0] = src[2][0];
  dest[2][1] = src[2][1];
  dest[3][0] = src[3][0];
  dest[3][1] = src[3][1];
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_mat4x2_copy(mat4x2 src, mat4x2 dest) {
  glm_mat4x2_copy(src, dest);
}